

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O3

FSerializer *
Serialize<line_t*,line_t*>
          (FSerializer *arc,char *key,TArray<line_t_*,_line_t_*> *value,
          TArray<line_t_*,_line_t_*> *param_4)

{
  bool bVar1;
  uint uVar2;
  uint amount;
  ulong uVar3;
  long lVar4;
  
  if ((arc->w == (FWriter *)0x0) || (value->Count != 0)) {
    bVar1 = FSerializer::BeginArray(arc,key);
    if (arc->r == (FReader *)0x0) {
      uVar2 = value->Count;
    }
    else {
      if (!bVar1) {
        if (value->Count == 0) {
          return arc;
        }
        value->Count = 0;
        return arc;
      }
      uVar2 = FSerializer::ArraySize(arc);
      amount = uVar2 - value->Count;
      if (value->Count <= uVar2 && amount != 0) {
        TArray<line_t_*,_line_t_*>::Grow(value,amount);
      }
      value->Count = uVar2;
    }
    if (uVar2 != 0) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        Serialize<line_t>(arc,(char *)0x0,(line_t_conflict **)((long)value->Array + lVar4),
                          (line_t_conflict **)0x0);
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 8;
      } while (uVar3 < value->Count);
    }
    FSerializer::EndArray(arc);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, TArray<T, TT> &value, TArray<T, TT> *)
{
	if (arc.isWriting())
	{
		if (value.Size() == 0) return arc;	// do not save empty arrays
	}
	bool res = arc.BeginArray(key);
	if (arc.isReading())
	{
		if (!res)
		{
			value.Clear();
			return arc;
		}
		value.Resize(arc.ArraySize());
	}
	for (unsigned i = 0; i < value.Size(); i++)
	{
		Serialize(arc, nullptr, value[i], (T*)nullptr);
	}
	arc.EndArray();
	return arc;
}